

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

void __thiscall
Diligent::RefCntAutoPtr<Diligent::CommandQueueVkImpl>::Release
          (RefCntAutoPtr<Diligent::CommandQueueVkImpl> *this)

{
  if (this->m_pObject != (CommandQueueVkImpl *)0x0) {
    RefCountedObject<Diligent::ICommandQueueVk>::Release
              ((RefCountedObject<Diligent::ICommandQueueVk> *)this->m_pObject);
    this->m_pObject = (CommandQueueVkImpl *)0x0;
  }
  return;
}

Assistant:

void Release() noexcept
    {
        if (m_pObject)
        {
            m_pObject->Release();
            m_pObject = nullptr;
        }
    }